

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitArrayInit(WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  undefined8 in_RAX;
  HeapType heapType;
  Expression *size;
  Expression *offset;
  Expression *index;
  Expression *child;
  ArrayInit *pAVar1;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_00;
  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
  *this_01;
  ArrayInitOp op;
  Builder local_48;
  Expression **local_40;
  uint32_t local_38;
  undefined4 local_34;
  Index segIdx;
  
  op = InitData;
  if (code == 0x54) {
    local_34 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    if (code != 0x55) {
      return false;
    }
    op = InitElem;
    local_34 = 0;
  }
  local_40 = out;
  heapType = getIndexedHeapType(this);
  local_38 = getU32LEB(this);
  size = popNonVoidExpression(this);
  offset = popNonVoidExpression(this);
  index = popNonVoidExpression(this);
  child = popNonVoidExpression(this);
  validateHeapTypeUsingChild(this,child,heapType);
  local_48.wasm = this->wasm;
  pAVar1 = Builder::makeArrayInit(&local_48,op,(Name)ZEXT816(0),child,index,offset,size);
  if ((char)local_34 == '\0') {
    this_01 = &this->elemRefs;
  }
  else {
    this_01 = &this->dataRefs;
  }
  this_00 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
            std::
            map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
            ::operator[](this_01,&local_38);
  local_48.wasm = (Module *)&pAVar1->segment;
  std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>
            (this_00,(Name **)&local_48);
  *local_40 = (Expression *)pAVar1;
  return true;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitArrayInit(Expression*& out, uint32_t code) {
  ArrayInitOp op;
  switch (code) {
    case BinaryConsts::ArrayInitData:
      op = InitData;
      break;
    case BinaryConsts::ArrayInitElem:
      op = InitElem;
      break;
    default:
      return false;
  }
  auto heapType = getIndexedHeapType();
  Index segIdx = getU32LEB();
  auto* size = popNonVoidExpression();
  auto* offset = popNonVoidExpression();
  auto* index = popNonVoidExpression();
  auto* ref = popNonVoidExpression();
  validateHeapTypeUsingChild(ref, heapType);
  auto* built =
    Builder(wasm).makeArrayInit(op, Name(), ref, index, offset, size);
  if (op == InitData) {
    dataRefs[segIdx].push_back(&built->segment);
  } else {
    elemRefs[segIdx].push_back(&built->segment);
  }
  out = built;
  return true;
}